

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O3

wchar_t borg_calc_formula(int *arg_formula)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  bool bVar4;
  int local_408 [258];
  
  if (arg_formula == (int *)0x0) {
    return L'\0';
  }
  piVar3 = local_408;
  local_408[0] = 0;
  do {
    switch(*arg_formula) {
    case 0:
      return piVar3[-1];
    case 1:
      iVar1 = arg_formula[1];
      goto LAB_001f653d;
    case 2:
      iVar1 = borg_has[arg_formula[1]];
LAB_001f653d:
      arg_formula = arg_formula + 1;
      *piVar3 = iVar1;
      piVar3 = piVar3 + 1;
      goto switchD_001f64d9_default;
    case 3:
      uVar2 = (uint)(piVar3[-2] == piVar3[-1]);
      break;
    case 4:
      bVar4 = piVar3[-2] == piVar3[-1];
      goto LAB_001f652d;
    case 5:
      piVar3[-1] = (uint)(piVar3[-1] == 0);
      goto switchD_001f64d9_default;
    case 6:
      uVar2 = (uint)(piVar3[-2] < piVar3[-1]);
      break;
    case 7:
      uVar2 = (uint)(piVar3[-2] <= piVar3[-1]);
      break;
    case 8:
      uVar2 = (uint)(piVar3[-1] < piVar3[-2]);
      break;
    case 9:
      uVar2 = (uint)(piVar3[-1] <= piVar3[-2]);
      break;
    case 10:
      uVar2 = (uint)(piVar3[-1] != 0 && piVar3[-2] != 0);
      goto LAB_001f65c5;
    case 0xb:
      bVar4 = piVar3[-1] == 0 && piVar3[-2] == 0;
LAB_001f652d:
      uVar2 = (uint)!bVar4;
      break;
    case 0xc:
      piVar3[-2] = piVar3[-2] + piVar3[-1];
      goto LAB_001f65c9;
    case 0xd:
      piVar3[-2] = piVar3[-2] - piVar3[-1];
      goto LAB_001f65c9;
    case 0xe:
      uVar2 = piVar3[-2] / (int)(piVar3[-1] + (uint)(piVar3[-1] == 0));
      goto LAB_001f65c5;
    case 0xf:
      uVar2 = piVar3[-2] * piVar3[-1];
LAB_001f65c5:
      piVar3[-2] = uVar2;
      goto LAB_001f65c9;
    default:
      goto switchD_001f64d9_default;
    }
    piVar3[-2] = uVar2;
LAB_001f65c9:
    piVar3 = piVar3 + -1;
switchD_001f64d9_default:
    arg_formula = arg_formula + 1;
  } while( true );
}

Assistant:

int borg_calc_formula(int* arg_formula)
{
    int  oper1; /* operand #1 */
    int  oper2; /* operand #2 */
    int  stack[256]; /* stack */
    int* stackptr; /* stack pointer */

    if (!arg_formula)
        return 0;

    *stack = 0;
    /* loop until we hit BFO_DONE */
    for (stackptr = stack; *arg_formula; arg_formula++) {
        switch (*arg_formula) {
            /* Number */
        case BFO_NUMBER:
            *stackptr++ = *++arg_formula;
            break;

        /* Variable */
        case BFO_VARIABLE:
            *stackptr++ = borg_has[*++arg_formula];
            break;

        /* Equal */
        case BFO_EQ:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 == oper2);
            break;

        /* Not Equal */
        case BFO_NEQ:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 != oper2);
            break;

        /* Less Than */
        case BFO_LT:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 < oper2);
            break;

        /* Less Than Or Equal */
        case BFO_LTE:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 <= oper2);
            break;

        /* Greater Than */
        case BFO_GT:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 > oper2);
            break;

        /* Greater Than Or Equal */
        case BFO_GTE:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 >= oper2);
            break;

        /* Logical And */
        case BFO_AND:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 && oper2);
            break;

        /* Logical Or */
        case BFO_OR:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 || oper2);
            break;

        /* Plus */
        case BFO_PLUS:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 + oper2);
            break;

        /* Minus */
        case BFO_MINUS:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 - oper2);
            break;

        /* Divide */
        case BFO_DIVIDE:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 / (oper2 ? oper2 : 1));
            break;

        /* Multiply */
        case BFO_MULT:
            oper2       = *--stackptr;
            oper1       = *--stackptr;
            *stackptr++ = (oper1 * oper2);
            break;

        /* Logical Not */
        case BFO_NOT:
            oper1       = *--stackptr;
            *stackptr++ = (!oper1);
            break;
        }
    }

    /* BFO_DONE */
    return *--stackptr;
}